

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O0

void __thiscall
Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::initialize_filtration
          (Simplex_tree<Simplex_tree_options_stable_simplex_handles> *this,
          bool ignore_infinite_values)

{
  anon_class_1_0_00000001 local_31;
  is_before_in_totally_ordered_filtration local_30;
  anon_class_1_0_00000001 local_21;
  is_before_in_totally_ordered_filtration local_20;
  undefined1 local_11;
  Simplex_tree<Simplex_tree_options_stable_simplex_handles> *pSStack_10;
  bool ignore_infinite_values_local;
  Simplex_tree<Simplex_tree_options_stable_simplex_handles> *this_local;
  
  local_11 = ignore_infinite_values;
  pSStack_10 = this;
  if (ignore_infinite_values) {
    is_before_in_totally_ordered_filtration::is_before_in_totally_ordered_filtration(&local_20,this)
    ;
    initialize_filtration<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::is_before_in_totally_ordered_filtration,Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::initialize_filtration(bool)const::_lambda(boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<int_const,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>>>,void*,(boost::container::tree_type_enum)0,true>,boost::intrusive::rbtree_node_traits<void*,true>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,false>,true>)_1_>
              (this,&local_20,&local_21);
  }
  else {
    is_before_in_totally_ordered_filtration::is_before_in_totally_ordered_filtration(&local_30,this)
    ;
    initialize_filtration<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::is_before_in_totally_ordered_filtration,Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::initialize_filtration(bool)const::_lambda(boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<int_const,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>>>,void*,(boost::container::tree_type_enum)0,true>,boost::intrusive::rbtree_node_traits<void*,true>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,false>,true>)_2_>
              (this,&local_30,&local_31);
  }
  return;
}

Assistant:

void initialize_filtration(bool ignore_infinite_values = false) const {
    if (ignore_infinite_values){
      initialize_filtration(is_before_in_totally_ordered_filtration(this), [&](Simplex_handle sh) -> bool {
        return filtration(sh) == Filtration_simplex_base_real::get_infinity();
      });
    } else {
      initialize_filtration(is_before_in_totally_ordered_filtration(this), [](Simplex_handle) -> bool {
        return false;
      });
    }
  }